

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddErrorArray(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                *this,ValidateErrorCode code,ISchemaValidator **subvalidators,SizeType count)

{
  ISchemaValidator *pIVar1;
  CrtAllocator *pCVar2;
  StringRefType *pSVar3;
  ulong uVar4;
  ValueType errors;
  Data local_58;
  StringRefType local_40;
  
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)0x4000000000000;
  if (count != 0) {
    uVar4 = 0;
    do {
      pIVar1 = subvalidators[uVar4];
      if (this->stateAllocator_ == (CrtAllocator *)0x0) {
        pCVar2 = (CrtAllocator *)operator_new(1);
        this->ownStateAllocator_ = pCVar2;
        this->stateAllocator_ = pCVar2;
      }
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(pIVar1 + 0x13),
                 this->stateAllocator_);
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.f.flags = 3;
  pSVar3 = GetErrorsString();
  local_40.s = pSVar3->s;
  local_40.length = pSVar3->length;
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_40,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s,
             this->stateAllocator_);
  AddCurrentError(this,code,false);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58.s);
  return;
}

Assistant:

void AddErrorArray(const ValidateErrorCode code,
        ISchemaValidator** subvalidators, SizeType count) {
        ValueType errors(kArrayType);
        for (SizeType i = 0; i < count; ++i)
            errors.PushBack(static_cast<GenericSchemaValidator*>(subvalidators[i])->GetError(), GetStateAllocator());
        currentError_.SetObject();
        currentError_.AddMember(GetErrorsString(), errors, GetStateAllocator());
        AddCurrentError(code);
    }